

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::App::run_callback(App *this)

{
  pointer ppAVar1;
  _Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_> local_28;
  
  (*this->_vptr_App[2])();
  if ((this->callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_()>::operator()(&this->callback_);
  }
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&local_28,&this->parsed_subcommands_
            );
  for (ppAVar1 = local_28._M_impl.super__Vector_impl_data._M_start;
      ppAVar1 != local_28._M_impl.super__Vector_impl_data._M_finish; ppAVar1 = ppAVar1 + 1) {
    run_callback(*ppAVar1);
  }
  std::_Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

void run_callback() {
        pre_callback();
        if(callback_)
            callback_();
        for(App *subc : get_subcommands()) {
            subc->run_callback();
        }
    }